

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O2

void __thiscall TestMustache::testFalsiness(TestMustache *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  QVariant *pQVar5;
  QVariantHash data;
  QVariant local_168;
  QArrayDataPointer<char16_t> local_148;
  anon_union_24_3_e3d07ef4_for_data local_128;
  QString _template;
  QtVariantContext context;
  Renderer renderer;
  
  Mustache::Renderer::Renderer(&renderer);
  data.d = (Data *)0x0;
  QString::QString(&_template,"{{#bool}}This should not be shown{{/bool}}");
  ::QVariant::QVariant((QVariant *)&context,0);
  QString::QString((QString *)&local_128,"bool");
  pQVar5 = QHash<QString,_QVariant>::operator[](&data,(QString *)&local_128);
  ::QVariant::operator=(pQVar5,(QVariant *)&context);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
  ::QVariant::~QVariant((QVariant *)&context);
  ::QVariant::QVariant((QVariant *)&local_128,(QHash *)&data);
  Mustache::QtVariantContext::QtVariantContext
            (&context,(QVariant *)&local_128,(PartialResolver *)0x0);
  ::QVariant::~QVariant((QVariant *)&local_128);
  Mustache::Renderer::render((QString *)&local_148,&renderer,&_template,&context.super_Context);
  if (local_148.size == 0) {
    cVar4 = QTest::qVerify(true,"output.isEmpty()","0 evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x8c);
  }
  else {
    cVar4 = QTest::qVerify(false,"output.isEmpty()","0 evaluated as truthy",
                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                           ,0x8c);
  }
  if (cVar4 != '\0') {
    ::QVariant::QVariant((QVariant *)&local_128,0);
    QString::QString((QString *)&local_168,"bool");
    pQVar5 = QHash<QString,_QVariant>::operator[](&data,(QString *)&local_168);
    ::QVariant::operator=(pQVar5,(QVariant *)&local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    ::QVariant::~QVariant((QVariant *)&local_128);
    ::QVariant::QVariant(&local_168,(QHash *)&data);
    Mustache::QtVariantContext::QtVariantContext
              ((QtVariantContext *)&local_128,&local_168,(PartialResolver *)0x0);
    Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_128);
    Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_128);
    ::QVariant::~QVariant(&local_168);
    Mustache::Renderer::render((QString *)&local_128,&renderer,&_template,&context.super_Context);
    qVar3 = local_148.size;
    pcVar2 = local_148.ptr;
    pDVar1 = local_148.d;
    local_148.d = (Data *)local_128.shared;
    local_148.ptr = (char16_t *)local_128._8_8_;
    local_128.shared = (PrivateShared *)pDVar1;
    local_128._8_8_ = pcVar2;
    local_148.size = local_128._16_8_;
    local_128._16_8_ = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
    if (local_148.size == 0) {
      cVar4 = QTest::qVerify(true,"output.isEmpty()","0u evaluated as truthy",
                             "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                             ,0x92);
    }
    else {
      cVar4 = QTest::qVerify(false,"output.isEmpty()","0u evaluated as truthy",
                             "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                             ,0x92);
    }
    if (cVar4 != '\0') {
      ::QVariant::QVariant((QVariant *)&local_128,0);
      QString::QString((QString *)&local_168,"bool");
      pQVar5 = QHash<QString,_QVariant>::operator[](&data,(QString *)&local_168);
      ::QVariant::operator=(pQVar5,(QVariant *)&local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
      ::QVariant::~QVariant((QVariant *)&local_128);
      ::QVariant::QVariant(&local_168,(QHash *)&data);
      Mustache::QtVariantContext::QtVariantContext
                ((QtVariantContext *)&local_128,&local_168,(PartialResolver *)0x0);
      Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_128);
      Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_128);
      ::QVariant::~QVariant(&local_168);
      Mustache::Renderer::render((QString *)&local_128,&renderer,&_template,&context.super_Context);
      qVar3 = local_148.size;
      pcVar2 = local_148.ptr;
      pDVar1 = local_148.d;
      local_148.d = (Data *)local_128.shared;
      local_148.ptr = (char16_t *)local_128._8_8_;
      local_128.shared = (PrivateShared *)pDVar1;
      local_128._8_8_ = pcVar2;
      local_148.size = local_128._16_8_;
      local_128._16_8_ = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
      if (local_148.size == 0) {
        cVar4 = QTest::qVerify(true,"output.isEmpty()","0ll evaluated as truthy",
                               "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                               ,0x98);
      }
      else {
        cVar4 = QTest::qVerify(false,"output.isEmpty()","0ll evaluated as truthy",
                               "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                               ,0x98);
      }
      if (cVar4 != '\0') {
        ::QVariant::QVariant((QVariant *)&local_128,0);
        QString::QString((QString *)&local_168,"bool");
        pQVar5 = QHash<QString,_QVariant>::operator[](&data,(QString *)&local_168);
        ::QVariant::operator=(pQVar5,(QVariant *)&local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
        ::QVariant::~QVariant((QVariant *)&local_128);
        ::QVariant::QVariant(&local_168,(QHash *)&data);
        Mustache::QtVariantContext::QtVariantContext
                  ((QtVariantContext *)&local_128,&local_168,(PartialResolver *)0x0);
        Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_128);
        Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_128);
        ::QVariant::~QVariant(&local_168);
        Mustache::Renderer::render
                  ((QString *)&local_128,&renderer,&_template,&context.super_Context);
        qVar3 = local_148.size;
        pcVar2 = local_148.ptr;
        pDVar1 = local_148.d;
        local_148.d = (Data *)local_128.shared;
        local_148.ptr = (char16_t *)local_128._8_8_;
        local_128.shared = (PrivateShared *)pDVar1;
        local_128._8_8_ = pcVar2;
        local_148.size = local_128._16_8_;
        local_128._16_8_ = qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
        if (local_148.size == 0) {
          cVar4 = QTest::qVerify(true,"output.isEmpty()","0ull evaluated as truthy",
                                 "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                 ,0x9e);
        }
        else {
          cVar4 = QTest::qVerify(false,"output.isEmpty()","0ull evaluated as truthy",
                                 "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                 ,0x9e);
        }
        if (cVar4 != '\0') {
          ::QVariant::QVariant((QVariant *)&local_128,0.0);
          QString::QString((QString *)&local_168,"bool");
          pQVar5 = QHash<QString,_QVariant>::operator[](&data,(QString *)&local_168);
          ::QVariant::operator=(pQVar5,(QVariant *)&local_128);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168)
          ;
          ::QVariant::~QVariant((QVariant *)&local_128);
          ::QVariant::QVariant(&local_168,(QHash *)&data);
          Mustache::QtVariantContext::QtVariantContext
                    ((QtVariantContext *)&local_128,&local_168,(PartialResolver *)0x0);
          Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_128);
          Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_128);
          ::QVariant::~QVariant(&local_168);
          Mustache::Renderer::render
                    ((QString *)&local_128,&renderer,&_template,&context.super_Context);
          qVar3 = local_148.size;
          pcVar2 = local_148.ptr;
          pDVar1 = local_148.d;
          local_148.d = (Data *)local_128.shared;
          local_148.ptr = (char16_t *)local_128._8_8_;
          local_128.shared = (PrivateShared *)pDVar1;
          local_128._8_8_ = pcVar2;
          local_148.size = local_128._16_8_;
          local_128._16_8_ = qVar3;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128)
          ;
          if (local_148.size == 0) {
            cVar4 = QTest::qVerify(true,"output.isEmpty()","0.0 evaluated as truthy",
                                   "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                   ,0xa4);
          }
          else {
            cVar4 = QTest::qVerify(false,"output.isEmpty()","0.0 evaluated as truthy",
                                   "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                   ,0xa4);
          }
          if (cVar4 != '\0') {
            ::QVariant::QVariant((QVariant *)&local_128,0.4);
            QString::QString((QString *)&local_168,"bool");
            pQVar5 = QHash<QString,_QVariant>::operator[](&data,(QString *)&local_168);
            ::QVariant::operator=(pQVar5,(QVariant *)&local_128);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_168);
            ::QVariant::~QVariant((QVariant *)&local_128);
            ::QVariant::QVariant(&local_168,(QHash *)&data);
            Mustache::QtVariantContext::QtVariantContext
                      ((QtVariantContext *)&local_128,&local_168,(PartialResolver *)0x0);
            Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_128);
            Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_128);
            ::QVariant::~QVariant(&local_168);
            Mustache::Renderer::render
                      ((QString *)&local_128,&renderer,&_template,&context.super_Context);
            qVar3 = local_148.size;
            pcVar2 = local_148.ptr;
            pDVar1 = local_148.d;
            local_148.d = (Data *)local_128.shared;
            local_148.ptr = (char16_t *)local_128._8_8_;
            local_128.shared = (PrivateShared *)pDVar1;
            local_128._8_8_ = pcVar2;
            local_148.size = local_128._16_8_;
            local_128._16_8_ = qVar3;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_128);
            if (local_148.size == 0) {
              cVar4 = QTest::qVerify(false,"!output.isEmpty()","0.4 evaluated as falsey",
                                     "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                     ,0xaa);
            }
            else {
              cVar4 = QTest::qVerify(true,"!output.isEmpty()","0.4 evaluated as falsey",
                                     "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                     ,0xaa);
            }
            if (cVar4 != '\0') {
              ::QVariant::QVariant((QVariant *)&local_128,0.5);
              QString::QString((QString *)&local_168,"bool");
              pQVar5 = QHash<QString,_QVariant>::operator[](&data,(QString *)&local_168);
              ::QVariant::operator=(pQVar5,(QVariant *)&local_128);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_168);
              ::QVariant::~QVariant((QVariant *)&local_128);
              ::QVariant::QVariant(&local_168,(QHash *)&data);
              Mustache::QtVariantContext::QtVariantContext
                        ((QtVariantContext *)&local_128,&local_168,(PartialResolver *)0x0);
              Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_128);
              Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_128);
              ::QVariant::~QVariant(&local_168);
              Mustache::Renderer::render
                        ((QString *)&local_128,&renderer,&_template,&context.super_Context);
              qVar3 = local_148.size;
              pcVar2 = local_148.ptr;
              pDVar1 = local_148.d;
              local_148.d = (Data *)local_128.shared;
              local_148.ptr = (char16_t *)local_128._8_8_;
              local_128.shared = (PrivateShared *)pDVar1;
              local_128._8_8_ = pcVar2;
              local_148.size = local_128._16_8_;
              local_128._16_8_ = qVar3;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_128);
              if (local_148.size == 0) {
                cVar4 = QTest::qVerify(false,"!output.isEmpty()","0.5f evaluated as falsey",
                                       "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                       ,0xb0);
              }
              else {
                cVar4 = QTest::qVerify(true,"!output.isEmpty()","0.5f evaluated as falsey",
                                       "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                       ,0xb0);
              }
              if (cVar4 != '\0') {
                ::QVariant::QVariant((QVariant *)&local_128,0.0);
                QString::QString((QString *)&local_168,"bool");
                pQVar5 = QHash<QString,_QVariant>::operator[](&data,(QString *)&local_168);
                ::QVariant::operator=(pQVar5,(QVariant *)&local_128);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_168);
                ::QVariant::~QVariant((QVariant *)&local_128);
                ::QVariant::QVariant(&local_168,(QHash *)&data);
                Mustache::QtVariantContext::QtVariantContext
                          ((QtVariantContext *)&local_128,&local_168,(PartialResolver *)0x0);
                Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_128);
                Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_128);
                ::QVariant::~QVariant(&local_168);
                Mustache::Renderer::render
                          ((QString *)&local_128,&renderer,&_template,&context.super_Context);
                qVar3 = local_148.size;
                pcVar2 = local_148.ptr;
                pDVar1 = local_148.d;
                local_148.d = (Data *)local_128.shared;
                local_148.ptr = (char16_t *)local_128._8_8_;
                local_128.shared = (PrivateShared *)pDVar1;
                local_128._8_8_ = pcVar2;
                local_148.size = local_128._16_8_;
                local_128._16_8_ = qVar3;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_128);
                if (local_148.size == 0) {
                  cVar4 = QTest::qVerify(true,"output.isEmpty()","0.0f evaluated as truthy",
                                         "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                         ,0xb6);
                }
                else {
                  cVar4 = QTest::qVerify(false,"output.isEmpty()","0.0f evaluated as truthy",
                                         "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                         ,0xb6);
                }
                if (cVar4 != '\0') {
                  ::QVariant::QVariant((QVariant *)&local_128,0);
                  QString::QString((QString *)&local_168,"bool");
                  pQVar5 = QHash<QString,_QVariant>::operator[](&data,(QString *)&local_168);
                  ::QVariant::operator=(pQVar5,(QVariant *)&local_128);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_168);
                  ::QVariant::~QVariant((QVariant *)&local_128);
                  ::QVariant::QVariant(&local_168,(QHash *)&data);
                  Mustache::QtVariantContext::QtVariantContext
                            ((QtVariantContext *)&local_128,&local_168,(PartialResolver *)0x0);
                  Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_128);
                  Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_128);
                  ::QVariant::~QVariant(&local_168);
                  Mustache::Renderer::render
                            ((QString *)&local_128,&renderer,&_template,&context.super_Context);
                  qVar3 = local_148.size;
                  pcVar2 = local_148.ptr;
                  pDVar1 = local_148.d;
                  local_148.d = (Data *)local_128.shared;
                  local_148.ptr = (char16_t *)local_128._8_8_;
                  local_128.shared = (PrivateShared *)pDVar1;
                  local_128._8_8_ = pcVar2;
                  local_148.size = local_128._16_8_;
                  local_128._16_8_ = qVar3;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_128);
                  if (local_148.size == 0) {
                    cVar4 = QTest::qVerify(true,"output.isEmpty()","\'",
                                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                           ,0xbc);
                  }
                  else {
                    cVar4 = QTest::qVerify(false,"output.isEmpty()","\'",
                                           "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                           ,0xbc);
                  }
                  if (cVar4 != '\0') {
                    ::QVariant::QVariant((QVariant *)&local_128,false);
                    QString::QString((QString *)&local_168,"bool");
                    pQVar5 = QHash<QString,_QVariant>::operator[](&data,(QString *)&local_168);
                    ::QVariant::operator=(pQVar5,(QVariant *)&local_128);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_168);
                    ::QVariant::~QVariant((QVariant *)&local_128);
                    ::QVariant::QVariant(&local_168,(QHash *)&data);
                    Mustache::QtVariantContext::QtVariantContext
                              ((QtVariantContext *)&local_128,&local_168,(PartialResolver *)0x0);
                    Mustache::QtVariantContext::operator=(&context,(QtVariantContext *)&local_128);
                    Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)&local_128);
                    ::QVariant::~QVariant(&local_168);
                    Mustache::Renderer::render
                              ((QString *)&local_128,&renderer,&_template,&context.super_Context);
                    qVar3 = local_148.size;
                    pcVar2 = local_148.ptr;
                    pDVar1 = local_148.d;
                    local_148.d = (Data *)local_128.shared;
                    local_148.ptr = (char16_t *)local_128._8_8_;
                    local_128.shared = (PrivateShared *)pDVar1;
                    local_128._8_8_ = pcVar2;
                    local_148.size = local_128._16_8_;
                    local_128._16_8_ = qVar3;
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_128);
                    QTest::qVerify(local_148.size == 0,"output.isEmpty()","\'",
                                   "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                                   ,0xc2);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  Mustache::QtVariantContext::~QtVariantContext(&context);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&_template.d);
  QHash<QString,_QVariant>::~QHash(&data);
  Mustache::Renderer::~Renderer(&renderer);
  return;
}

Assistant:

void TestMustache::testFalsiness()
{
	Mustache::Renderer renderer;
	QVariantHash data;
	QString _template = "{{#bool}}This should not be shown{{/bool}}";

	// test falsiness of 0
	data["bool"] = 0;
	Mustache::QtVariantContext context = Mustache::QtVariantContext(data);
	QString output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0 evaluated as truthy");

	// test falsiness of 0u
	data["bool"] = 0u;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0u evaluated as truthy");

	// test falsiness of 0ll
	data["bool"] = 0ll;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0ll evaluated as truthy");

	// test falsiness of 0ull
	data["bool"] = 0ull;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0ull evaluated as truthy");

	// test falsiness of 0.0
	data["bool"] = 0.0;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0.0 evaluated as truthy");

	// test falsiness of 0.4
	data["bool"] = 0.4f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(!output.isEmpty(), "0.4 evaluated as falsey");

	// test falsiness of 0.5
	data["bool"] = 0.5f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(!output.isEmpty(), "0.5f evaluated as falsey");

	// test falsiness of 0.0f
	data["bool"] = 0.0f;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "0.0f evaluated as truthy");

	// test falsiness of '\0'
	data["bool"] = '\0';
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "'\0' evaluated as truthy");

	// test falsiness of 'false'
	data["bool"] = false;
	context = Mustache::QtVariantContext(data);
	output = renderer.render(_template, &context);
	QVERIFY2(output.isEmpty(), "'\0' evaluated as truthy");
}